

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

int UnicodeToUTF8(LPCWSTR lpSrcStr,int cchSrc,LPSTR lpDestStr,int cchDest)

{
  byte bVar1;
  WCHAR WVar2;
  int iVar3;
  WCHAR WVar4;
  uint uVar5;
  int iVar6;
  
  if (cchSrc == 0) {
    iVar3 = 0;
    cchSrc = -1;
  }
  else {
    WVar4 = L'\0';
    iVar3 = 0;
    do {
      if ((cchDest != 0) && (cchDest <= iVar3)) {
        cchSrc = cchSrc + -1;
        goto LAB_00333aab;
      }
      WVar2 = *lpSrcStr;
      uVar5 = (uint)(ushort)WVar2;
      bVar1 = (byte)((ushort)WVar4 >> 8);
      if ((WVar2 & 0xfc00U) == 0xd800) {
        if (cchDest == 0) {
          iVar3 = iVar3 + 3;
        }
        else if (WVar4 != L'\0') {
          iVar6 = iVar3 + 2;
          if (cchDest <= iVar6) goto LAB_00333aab;
          lpDestStr[iVar3] = bVar1 >> 4 | 0xe0;
          lpDestStr[iVar3 + 1] = (byte)((ushort)WVar4 >> 6) & 0x3f | 0x80;
          iVar3 = iVar3 + 3;
          lpDestStr[iVar6] = (byte)WVar4 & 0x3f | 0x80;
          WVar2 = *lpSrcStr;
        }
      }
      else {
        if (WVar4 == L'\0') {
          if ((ushort)WVar2 < 0x80) {
            if (cchDest != 0) goto LAB_003339af;
            goto LAB_003339df;
          }
          if ((ushort)WVar2 < 0x800) {
            if (cchDest == 0) goto LAB_00333a7a;
LAB_003339f3:
            iVar6 = iVar3 + 1;
            if (cchDest <= iVar6) goto LAB_00333b02;
            lpDestStr[iVar3] = (byte)(uVar5 >> 6) | 0xc0;
            bVar1 = (byte)*lpSrcStr;
            iVar3 = iVar3 + 2;
          }
          else {
            if (cchDest == 0) {
LAB_00333a7f:
              iVar3 = iVar3 + 3;
              goto LAB_00333a82;
            }
LAB_00333a23:
            iVar6 = iVar3 + 2;
            if (cchDest <= iVar6) goto LAB_00333b02;
            lpDestStr[iVar3] = (byte)(uVar5 >> 0xc) | 0xe0;
            lpDestStr[iVar3 + 1] = (byte)((ushort)*lpSrcStr >> 6) & 0x3f | 0x80;
            bVar1 = (byte)*lpSrcStr;
            iVar3 = iVar3 + 3;
          }
          lpDestStr[iVar6] = bVar1 & 0x3f | 0x80;
        }
        else {
          if ((WVar2 & 0xfc00U) == 0xdc00) {
            if (cchDest != 0) {
              iVar6 = iVar3 + 3;
              if (iVar6 < cchDest) {
                uVar5 = (uint)(ushort)WVar4 * 0x400 + (uint)(ushort)WVar2 + 0xfca02400;
                lpDestStr[iVar3] = (byte)(uVar5 >> 0x12) | 0xf0;
                lpDestStr[iVar3 + 1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
                lpDestStr[iVar3 + 2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                iVar3 = iVar3 + 4;
                lpDestStr[iVar6] = (byte)WVar2 & 0x3f | 0x80;
                goto LAB_00333a82;
              }
              goto LAB_00333aab;
            }
          }
          else if (cchDest == 0) {
            if (0x7f < (ushort)WVar2) {
              if (0x7ff < (ushort)WVar2) goto LAB_00333a7f;
LAB_00333a7a:
              iVar3 = iVar3 + 2;
              goto LAB_00333a82;
            }
          }
          else {
            iVar6 = iVar3 + 2;
            if (cchDest <= iVar6) goto LAB_00333aab;
            lpDestStr[iVar3] = bVar1 >> 4 | 0xe0;
            lpDestStr[iVar3 + 1] = (byte)((ushort)WVar4 >> 6) & 0x3f | 0x80;
            iVar3 = iVar3 + 3;
            lpDestStr[iVar6] = (byte)WVar4 & 0x3f | 0x80;
            uVar5 = (uint)(ushort)*lpSrcStr;
            if (0x7f < (ushort)*lpSrcStr) {
              if (0x7ff < uVar5) goto LAB_00333a23;
              goto LAB_003339f3;
            }
LAB_003339af:
            if (cchDest <= iVar3) goto LAB_00333b02;
            lpDestStr[iVar3] = (CHAR)uVar5;
          }
LAB_003339df:
          iVar3 = iVar3 + 1;
        }
LAB_00333a82:
        WVar2 = L'\0';
      }
      WVar4 = WVar2;
      cchSrc = cchSrc + -1;
      lpSrcStr = lpSrcStr + 1;
    } while (cchSrc != 0);
    cchSrc = -1;
LAB_00333aab:
    if (((cchDest != 0) && (cchSrc < 0)) && (WVar4 != L'\0')) {
      if (iVar3 + 2 < cchDest) {
        lpDestStr[iVar3] = (byte)((ushort)WVar4 >> 0xc) | 0xe0;
        lpDestStr[iVar3 + 1] = (byte)((ushort)WVar4 >> 6) & 0x3f | 0x80;
        lpDestStr[iVar3 + 2] = (byte)WVar4 & 0x3f | 0x80;
        return iVar3 + 3;
      }
      cchSrc = cchSrc + 1;
    }
  }
LAB_00333b02:
  if ((cchDest != 0) && (-1 < cchSrc)) {
    SetLastError(0x7a);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int UnicodeToUTF8(
    LPCWSTR lpSrcStr,
    int cchSrc,
    LPSTR lpDestStr,
    int cchDest)
{
    LPCWSTR lpWC = lpSrcStr;
    int     cchU8 = 0;                // # of UTF8 chars generated
    DWORD   dwSurrogateChar;
    WCHAR   wchHighSurrogate = 0;
    BOOL    bHandled;


    while ((cchSrc--) && ((cchDest == 0) || (cchU8 < cchDest)))
    {
        bHandled = FALSE;

        //
        // Check if high surrogate is available
        //
        if ((*lpWC >= HIGH_SURROGATE_START) && (*lpWC <= HIGH_SURROGATE_END))
        {
            if (cchDest)
            {
                // Another high surrogate, then treat the 1st as normal
                // Unicode character.
                if (wchHighSurrogate)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                    }
                    else
                    {
                        // not enough buffer
                        cchSrc++;
                        break;
                    }
                }
            }
            else
            {
                cchU8 += 3;
            }
            wchHighSurrogate = *lpWC;
            bHandled = TRUE;
        }

        if (!bHandled && wchHighSurrogate)
        {
            if ((*lpWC >= LOW_SURROGATE_START) && (*lpWC <= LOW_SURROGATE_END))
            {
                 // wheee, valid surrogate pairs

                 if (cchDest)
                 {
                     if ((cchU8 + 3) < cchDest)
                     {
                         dwSurrogateChar = (((wchHighSurrogate-0xD800) << 10) + (*lpWC - 0xDC00) + 0x10000);

                         lpDestStr[cchU8++] = (UTF8_1ST_OF_4 |
                                               (unsigned char)(dwSurrogateChar >> 18));           // 3 bits from 1st byte

                         lpDestStr[cchU8++] =  (UTF8_TRAIL |
                                                (unsigned char)((dwSurrogateChar >> 12) & 0x3f)); // 6 bits from 2nd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)((dwSurrogateChar >> 6) & 0x3f));   // 6 bits from 3rd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)(0x3f & dwSurrogateChar));          // 6 bits from 4th byte
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
                 else
                 {
                     // we already counted 3 previously (in high surrogate)
                     cchU8 ++;
                 }

                 bHandled = TRUE;
            }
            else
            {
                 // Bad Surrogate pair : ERROR
                 // Just process wchHighSurrogate , and the code below will
                 // process the current code point
                 if (cchDest)
                 {
                     if ((cchU8 + 2) < cchDest)
                     {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
            }

            wchHighSurrogate = 0;
        }

        if (!bHandled)
        {
            if (*lpWC <= ASCII)
            {
                //
                //  Found ASCII.
                //
                if (cchDest)
                {
                    if (cchU8 < cchDest) 
                    {
                        lpDestStr[cchU8] = (char)*lpWC;
                    } 
                    else 
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                cchU8++;
            }
            else if (*lpWC <= UTF8_2_MAX)
            {
                //
                //  Found 2 byte sequence if < 0x07ff (11 bits).
                //
                if (cchDest)
                {
                    if ((cchU8 + 1) < cchDest)
                    {
                        //
                        //  Use upper 5 bits in first byte.
                        //  Use lower 6 bits in second byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_2 | (*lpWC >> 6);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 2;
                }
            }
            else
            {
                //
                //  Found 3 byte sequence.
                //
                if (cchDest)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        //
                        //  Use upper  4 bits in first byte.
                        //  Use middle 6 bits in second byte.
                        //  Use lower  6 bits in third byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 3;
                }
            }
        }

        lpWC++;
    }

    //
    // If the last character was a high surrogate, then handle it as a normal
    // unicode character.
    //
    if ((cchSrc < 0) && (wchHighSurrogate != 0))
    {
        if (cchDest)
        {
            if ((cchU8 + 2) < cchDest)
            {
                lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
            }
            else
            {
                cchSrc++;
            }
        }
    }

    //
    //  Make sure the destination buffer was large enough.
    //
    if (cchDest && (cchSrc >= 0))
    {
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return (0);
    }

    //
    //  Return the number of UTF-8 characters written.
    //
    return (cchU8);
}